

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::AggregationPS::AggregationPS
          (AggregationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _i,int _j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *oldupper,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldlower,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  pointer pnVar5;
  Item *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b5810;
  (this->super_PostStep).m_name = "Aggregation";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_70);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__AggregationPS_003b5ad8;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 0x20);
  uVar7 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar8 = *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_j].m_backend.data + 0x10);
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_upper).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2) = uVar8;
  (this->m_upper).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_upper).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar10 = pnVar5[_j].m_backend.prec_elem;
  (this->m_upper).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_upper).m_backend.prec_elem = iVar10;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 0x20);
  uVar7 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar8 = *(undefined8 *)((long)&pnVar5[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[_j].m_backend.data + 0x10);
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_lower).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2) = uVar8;
  (this->m_lower).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_lower).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar10 = pnVar5[_j].m_backend.prec_elem;
  (this->m_lower).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_lower).m_backend.prec_elem = iVar10;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_obj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_68,lp,_j);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8) =
         local_68.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) =
         local_68.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6) =
         local_68.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this->m_obj).m_backend.data._M_elems = local_68.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) =
         local_68.m_backend.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_68.m_backend.exp;
    (this->m_obj).m_backend.neg = local_68.m_backend.neg;
    (this->m_obj).m_backend.fpclass = local_68.m_backend.fpclass;
    (this->m_obj).m_backend.prec_elem = local_68.m_backend.prec_elem;
    if (local_68.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_obj).m_backend.data._M_elems[0] != 0) {
      (this->m_obj).m_backend.neg = (bool)(local_68.m_backend.neg ^ 1);
    }
  }
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldupper->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)(oldupper->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((oldupper->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((oldupper->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 4) =
       *(undefined8 *)((oldupper->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_oldupper).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 2) = uVar8;
  (this->m_oldupper).m_backend.exp = (oldupper->m_backend).exp;
  (this->m_oldupper).m_backend.neg = (oldupper->m_backend).neg;
  iVar10 = (oldupper->m_backend).prec_elem;
  (this->m_oldupper).m_backend.fpclass = (oldupper->m_backend).fpclass;
  (this->m_oldupper).m_backend.prec_elem = iVar10;
  uVar7 = *(undefined8 *)((oldlower->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)((oldlower->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)((oldlower->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_oldlower).m_backend.data._M_elems =
       *(undefined8 *)(oldlower->m_backend).data._M_elems;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 2) = uVar7;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 4) = uVar8;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldlower->m_backend).data._M_elems + 8);
  (this->m_oldlower).m_backend.exp = (oldlower->m_backend).exp;
  (this->m_oldlower).m_backend.neg = (oldlower->m_backend).neg;
  iVar10 = (oldlower->m_backend).prec_elem;
  (this->m_oldlower).m_backend.fpclass = (oldlower->m_backend).fpclass;
  (this->m_oldlower).m_backend.prec_elem = iVar10;
  uVar7 = *(undefined8 *)((rhs->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)((rhs->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)((rhs->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems =
       *(undefined8 *)(rhs->m_backend).data._M_elems;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar7;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = uVar8;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((rhs->m_backend).data._M_elems + 8);
  (this->m_rhs).m_backend.exp = (rhs->m_backend).exp;
  (this->m_rhs).m_backend.neg = (rhs->m_backend).neg;
  iVar10 = (rhs->m_backend).prec_elem;
  (this->m_rhs).m_backend.fpclass = (rhs->m_backend).fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar10;
  pIVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_i].idx;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b4310;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             pIVar6[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar6 + iVar2));
  pIVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_j].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b4310;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar6[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar6 + iVar2));
  return;
}

Assistant:

AggregationPS(const SPxLPBase<R>& lp, int _i, int _j, R rhs, R oldupper, R oldlower,
                    std::shared_ptr<Tolerances> tols)
         : PostStep("Aggregation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_upper(lp.upper(_j))
         , m_lower(lp.lower(_j))
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_oldupper(oldupper)
         , m_oldlower(oldlower)
         , m_rhs(rhs)
         , m_row(lp.rowVector(_i))
         , m_col(lp.colVector(_j))
      {
         assert(m_row[m_j] != 0.0);
      }